

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void rec_func_setup(jit_State *J)

{
  byte bVar1;
  GCproto *pGVar2;
  uint local_1c;
  BCReg numparams;
  BCReg s;
  GCproto *pt;
  jit_State *J_local;
  
  pGVar2 = J->pt;
  bVar1 = pGVar2->numparams;
  if ((pGVar2->flags & 8) != 0) {
    lj_trace_err(J,LJ_TRERR_CJITOFF);
  }
  if (0xf9 < J->baseslot + (uint)pGVar2->framesize) {
    lj_trace_err(J,LJ_TRERR_STACKOV);
  }
  for (local_1c = J->maxslot; local_1c < bVar1; local_1c = local_1c + 1) {
    J->base[local_1c] = 0x7fff;
  }
  J->maxslot = (uint)bVar1;
  return;
}

Assistant:

static void rec_func_setup(jit_State *J)
{
  GCproto *pt = J->pt;
  BCReg s, numparams = pt->numparams;
  if ((pt->flags & PROTO_NOJIT))
    lj_trace_err(J, LJ_TRERR_CJITOFF);
  if (J->baseslot + pt->framesize >= LJ_MAX_JSLOTS)
    lj_trace_err(J, LJ_TRERR_STACKOV);
  /* Fill up missing parameters with nil. */
  for (s = J->maxslot; s < numparams; s++)
    J->base[s] = TREF_NIL;
  /* The remaining slots should never be read before they are written. */
  J->maxslot = numparams;
}